

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O1

int compare_patches_internal
              (int me,double eps,int ndim,double *array1,int *lo1,int *hi1,int *dims1,double *array2
              ,int *lo2,int *hi2,int *dims2)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  int subscr2 [7];
  int subscr1 [7];
  char val [48];
  char msg [48];
  long local_f8;
  int local_d8 [8];
  int local_b8 [8];
  char local_98 [48];
  char local_68 [56];
  
  uVar10 = 0;
  uVar3 = (ulong)(uint)ndim;
  if (0 < ndim) {
    iVar4 = 1;
    uVar1 = 0;
    do {
      uVar9 = (int)uVar10 + lo1[uVar1] * iVar4;
      uVar10 = (ulong)uVar9;
      iVar4 = iVar4 * dims1[uVar1];
      uVar1 = uVar1 + 1;
    } while (uVar3 != uVar1);
    uVar10 = (ulong)(int)uVar9;
  }
  uVar1 = 0;
  if (0 < ndim) {
    iVar4 = 1;
    uVar2 = 0;
    do {
      uVar9 = (int)uVar1 + lo2[uVar2] * iVar4;
      uVar1 = (ulong)uVar9;
      iVar4 = iVar4 * dims2[uVar2];
      uVar2 = uVar2 + 1;
    } while (uVar3 != uVar2);
    uVar1 = (ulong)(int)uVar9;
  }
  if (ndim < 1) {
    iVar4 = 1;
  }
  else {
    iVar4 = 1;
    uVar2 = 0;
    do {
      iVar7 = hi1[uVar2] - lo1[uVar2];
      iVar8 = lo2[uVar2];
      if (iVar7 != hi2[uVar2] - iVar8) {
        __assert_fail("diff == (hi2[i]-lo2[i])",
                      "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/global/testing/util.c"
                      ,0xde,
                      "int compare_patches_internal(int, double, int, double *, int *, int *, int *, double *, int *, int *, int *)"
                     );
      }
      if (dims1[uVar2] <= iVar7) {
        __assert_fail("diff < dims1[i]",
                      "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/global/testing/util.c"
                      ,0xdf,
                      "int compare_patches_internal(int, double, int, double *, int *, int *, int *, double *, int *, int *, int *)"
                     );
      }
      if (dims2[uVar2] <= iVar7) {
        __assert_fail("diff < dims2[i]",
                      "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/global/testing/util.c"
                      ,0xe0,
                      "int compare_patches_internal(int, double, int, double *, int *, int *, int *, double *, int *, int *, int *)"
                     );
      }
      iVar4 = iVar4 * (iVar7 + 1);
      local_b8[uVar2] = lo1[uVar2];
      local_d8[uVar2] = iVar8;
      uVar2 = uVar2 + 1;
    } while (uVar3 != uVar2);
  }
  if (0 < iVar4) {
    local_f8 = 0;
    lVar11 = 0;
    iVar8 = 0;
    do {
      if (ndim < 1) {
        lVar6 = 0;
      }
      else {
        uVar2 = 0;
        iVar5 = 1;
        iVar7 = 0;
        do {
          iVar7 = iVar7 + local_b8[uVar2] * iVar5;
          iVar5 = iVar5 * dims1[uVar2];
          uVar2 = uVar2 + 1;
        } while (uVar3 != uVar2);
        lVar6 = (long)iVar7;
      }
      if (ndim < 1) {
        lVar12 = 0;
      }
      else {
        uVar2 = 0;
        iVar7 = 1;
        iVar5 = 0;
        do {
          iVar5 = iVar5 + local_d8[uVar2] * iVar7;
          iVar7 = iVar7 * dims2[uVar2];
          uVar2 = uVar2 + 1;
        } while (uVar3 != uVar2);
        lVar12 = (long)iVar5;
      }
      if (iVar8 == 0) {
        local_f8 = lVar12;
        lVar11 = lVar6;
      }
      dVar13 = array1[uVar10 + (lVar6 - lVar11)];
      dVar14 = array2[uVar1 + (lVar12 - local_f8)];
      dVar16 = -dVar13;
      dVar15 = dVar16;
      if (dVar16 <= dVar13) {
        dVar15 = dVar13;
      }
      dVar17 = -dVar14;
      dVar18 = dVar17;
      if (dVar17 <= dVar14) {
        dVar18 = dVar14;
      }
      if (dVar18 <= dVar15) {
        dVar15 = dVar13;
        if (dVar13 < 0.0) {
          dVar15 = dVar16;
        }
      }
      else {
        dVar15 = dVar14;
        if (dVar14 < 0.0) {
          dVar15 = dVar17;
        }
      }
      dVar13 = dVar13 - dVar14;
      dVar14 = -dVar13;
      if (-dVar13 <= dVar13) {
        dVar14 = dVar13;
      }
      if (eps < dVar14 / (double)(-(ulong)(dVar15 == 0.0) & 0x3ff0000000000000 |
                                 ~-(ulong)(dVar15 == 0.0) &
                                 (~-(ulong)(dVar15 < eps) & (ulong)dVar15 |
                                 -(ulong)(dVar15 < eps) & 0x3ff0000000000000))) {
        sprintf(local_68,"ERROR (proc=%d): a",(ulong)(uint)me);
        sprintf(local_98,"=%f, ",array1[uVar10 + (lVar6 - lVar11)]);
        print_subscript(local_68,ndim,local_b8,local_98);
        sprintf(local_68,"=%f\n",array2[uVar1 + (lVar12 - local_f8)]);
        print_subscript(" b",ndim,local_d8,local_68);
        sleep(1);
        return 1;
      }
      if (0 < ndim) {
        uVar2 = 0;
        do {
          if (local_b8[uVar2] < hi1[uVar2]) {
            local_b8[uVar2] = local_b8[uVar2] + 1;
            break;
          }
          local_b8[uVar2] = lo1[uVar2];
          uVar2 = uVar2 + 1;
        } while (uVar3 != uVar2);
        if (0 < ndim) {
          uVar2 = 0;
          do {
            if (local_d8[uVar2] < hi2[uVar2]) {
              local_d8[uVar2] = local_d8[uVar2] + 1;
              break;
            }
            local_d8[uVar2] = lo2[uVar2];
            uVar2 = uVar2 + 1;
          } while (uVar3 != uVar2);
        }
      }
      iVar8 = iVar8 + 1;
    } while (iVar8 != iVar4);
  }
  return 0;
}

Assistant:

int compare_patches_internal(int me, double eps, int ndim, double *array1, 
                     int lo1[], int hi1[], int dims1[],
             double *array2, int lo2[], int hi2[], 
                     int dims2[])
{
    int i,j, elems=1;    
    int subscr1[GA_MAX_DIM], subscr2[GA_MAX_DIM];
    double diff,max;
    double *patch1, *patch2;
    Integer idx1, idx2, offset1=0, offset2=0;

        /* compute pointer to first element in patch */ 
    patch1 = array1 +  Index(ndim, lo1, dims1);    
    patch2 = array2 +  Index(ndim, lo2, dims2);    

        /* count # of elements & verify consistency of both patches */
    for(i=0;i<ndim;i++){  
        Integer diff = hi1[i]-lo1[i];
        assert(diff == (hi2[i]-lo2[i]));
        assert(diff < dims1[i]);
        assert(diff < dims2[i]);
        elems *= diff+1;
        subscr1[i]= lo1[i];
        subscr2[i]=lo2[i];
    }

    /* compare element values in both patches */ 
    for(j=0; j< elems; j++){ 
                /* calculate element Index from a subscript */
        idx1 = Index(ndim, subscr1, dims1);    
        idx2 = Index(ndim, subscr2, dims2);

        if(j==0){
            offset1 =idx1;
            offset2 =idx2;
        }
        idx1 -= offset1;
        idx2 -= offset2;

                diff = patch1[idx1] - patch2[idx2];
                max  = GA_MAX(GA_ABS(patch1[idx1]),GA_ABS(patch2[idx2]));
                if(max == 0. || max <eps) max = 1.; 

        if(eps < GA_ABS(diff)/max){
            char msg[48], val[48];
            sprintf(msg,"ERROR (proc=%d): a",me);
            sprintf(val,"=%f, ",patch1[idx1]);
            print_subscript(msg,ndim,subscr1,val);
            sprintf(msg,"=%f\n",patch2[idx2]);
            print_subscript(" b",ndim,subscr2,msg);
                        sleep(1);
                        return(1);
        }

        { /* update subscript for the patches */
           update_subscript(ndim, subscr1, lo1,hi1, dims1);
           update_subscript(ndim, subscr2, lo2,hi2, dims2);
        }
    }

        return(0);
}